

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O2

void vkt::anon_unknown_0::logTestCaseInfo
               (TestLog *log,TestConfig *config,
               vector<bool,_std::allocator<bool>_> *attachmentIsLazy,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *imageClearValues,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,
               vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
               *subpassRenderInfo)

{
  ostringstream *poVar1;
  ostringstream *poVar2;
  pointer pSVar3;
  long lVar4;
  pointer pSVar5;
  VkClearValue *pVVar6;
  DepthStencilClear *vec;
  RenderQuad *pRVar7;
  ulong uVar8;
  ulong uVar9;
  const_reference cVar10;
  MessageBuilder *this;
  Vector<unsigned_int,_2> *vec_00;
  vector<bool,_std::allocator<bool>_> *pvVar11;
  ostringstream *poVar12;
  pointer vec_01;
  uint uVar13;
  DepthStencilClear *depthStencilClear;
  RenderQuad *renderQuad;
  pointer pAVar14;
  long lVar15;
  VkClearValue value;
  VkClearValue value_00;
  VkClearColorValue value_01;
  ulong local_270;
  ScopedLogSection section;
  ulong local_258;
  ScopedLogSection attachmentsSection;
  ScopedLogSection inputAttachmentsSection;
  ScopedLogSection inputAttachmentSection;
  string local_238;
  string local_218;
  ScopedLogSection attachmentSection;
  ScopedLogSection depthStencilAttachmentSection;
  MessageBuilder local_1d0;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_> *local_50;
  vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_> *local_48;
  vector<bool,_std::allocator<bool>_> *local_40;
  vector<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
  *local_38;
  
  local_50 = renderPassClearValues;
  local_48 = imageClearValues;
  local_40 = attachmentIsLazy;
  local_38 = subpassRenderInfo;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"RenderPass",(allocator<char> *)&depthStencilAttachmentSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"RenderPass",(allocator<char> *)&local_218);
  tcu::ScopedLogSection::ScopedLogSection(&section,log,(string *)&local_1d0,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Attachments",(allocator<char> *)&depthStencilAttachmentSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Attachments",(allocator<char> *)&local_218);
  tcu::ScopedLogSection::ScopedLogSection(&attachmentsSection,log,(string *)&local_1d0,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d0);
  poVar12 = &local_1d0.m_str;
  local_258 = 0;
  while( true ) {
    if ((ulong)((long)(config->renderPass).m_attachments.
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(config->renderPass).m_attachments.
                      super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) <= local_258) break;
    de::toString<unsigned_long>(&local_238,&local_258);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "Attachment",&local_238);
    de::toString<unsigned_long>(&local_218,&local_258);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection,"Attachment ",&local_218);
    tcu::ScopedLogSection::ScopedLogSection
              (&attachmentSection,log,(string *)&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_238);
    pAVar14 = (config->renderPass).m_attachments.
              super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
              ._M_impl.super__Vector_impl_data._M_start + local_258;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
    std::operator<<((ostream *)poVar12,"Format: ");
    ::vk::operator<<((ostream *)poVar12,pAVar14->m_format);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Samples: ");
    std::ostream::operator<<(poVar1,pAVar14->m_samples);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"LoadOp: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_loadOp);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"StoreOp: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_storeOp);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"StencilLoadOp: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_stencilLoadOp);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"StencilStoreOp: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_stencilStoreOp);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"InitialLayout: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_initialLayout);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"FinalLayout: ");
    ::vk::operator<<((ostream *)poVar1,pAVar14->m_finalLayout);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    tcu::ScopedLogSection::~ScopedLogSection(&attachmentSection);
    local_258 = local_258 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&attachmentsSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d0,"Subpasses",(allocator<char> *)&depthStencilAttachmentSection);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,"Subpasses",(allocator<char> *)&local_218);
  tcu::ScopedLogSection::ScopedLogSection(&attachmentsSection,log,(string *)&local_1d0,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_1d0);
  local_258 = 0;
  while( true ) {
    if ((ulong)(((long)(config->renderPass).m_subpasses.
                       super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(config->renderPass).m_subpasses.
                      super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= local_258) break;
    de::toString<unsigned_long>(&local_238,&local_258);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "Subpass",&local_238);
    de::toString<unsigned_long>(&local_218,&local_258);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection,"Subpass ",&local_218);
    tcu::ScopedLogSection::ScopedLogSection
              (&attachmentSection,log,(string *)&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_238);
    uVar9 = local_258;
    pSVar3 = (config->renderPass).m_subpasses.
             super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (*(pointer *)
         &pSVar3[local_258].m_inputAttachments.
          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          ._M_impl !=
        *(pointer *)
         ((long)&pSVar3[local_258].m_inputAttachments.
                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ._M_impl + 8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"Inputs",(allocator<char> *)&depthStencilAttachmentSection);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Inputs",(allocator<char> *)&local_218);
      tcu::ScopedLogSection::ScopedLogSection
                (&inputAttachmentsSection,log,(string *)&local_1d0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d0);
      for (local_270 = 0;
          local_270 <
          (ulong)((long)*(pointer *)
                         ((long)&pSVar3[uVar9].m_inputAttachments.
                                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                 ._M_impl + 8) -
                  *(long *)&pSVar3[uVar9].m_inputAttachments.
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data >> 3); local_270 = local_270 + 1) {
        de::toString<unsigned_long>(&local_238,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,"Input",&local_238);
        de::toString<unsigned_long>(&local_218,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depthStencilAttachmentSection,"Input ",&local_218);
        tcu::ScopedLogSection::ScopedLogSection
                  (&inputAttachmentSection,log,(string *)&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_238);
        uVar8 = local_270;
        lVar4 = *(long *)&pSVar3[uVar9].m_inputAttachments.
                          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                          ._M_impl.super__Vector_impl_data;
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Attachment: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Layout: ");
        ::vk::operator<<((ostream *)poVar12,*(VkImageLayout *)(lVar4 + 4 + uVar8 * 8));
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentSection);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentsSection);
    }
    if (pSVar3[uVar9].m_depthStencilAttachment.m_attachment != 0xffffffff) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"DepthStencil",(allocator<char> *)&local_218);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"DepthStencil",(allocator<char> *)&inputAttachmentsSection);
      tcu::ScopedLogSection::ScopedLogSection
                (&depthStencilAttachmentSection,log,(string *)&local_1d0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d0);
      poVar12 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
      std::operator<<((ostream *)poVar12,"Attachment: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      poVar12 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
      std::operator<<((ostream *)poVar12,"Layout: ");
      ::vk::operator<<((ostream *)poVar12,pSVar3[uVar9].m_depthStencilAttachment.m_layout);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      tcu::ScopedLogSection::~ScopedLogSection(&depthStencilAttachmentSection);
    }
    if (pSVar3[uVar9].m_colorAttachments.
        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&pSVar3[uVar9].m_colorAttachments.
                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ._M_impl + 8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"Colors",(allocator<char> *)&depthStencilAttachmentSection);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Colors",(allocator<char> *)&local_218);
      tcu::ScopedLogSection::ScopedLogSection
                (&inputAttachmentsSection,log,(string *)&local_1d0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d0);
      for (local_270 = 0;
          local_270 <
          (ulong)((long)*(pointer *)
                         ((long)&pSVar3[uVar9].m_colorAttachments.
                                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                 ._M_impl + 8) -
                  *(long *)&pSVar3[uVar9].m_colorAttachments.
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data >> 3); local_270 = local_270 + 1) {
        de::toString<unsigned_long>(&local_238,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,"Color",&local_238);
        de::toString<unsigned_long>(&local_218,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depthStencilAttachmentSection,"Color ",&local_218);
        tcu::ScopedLogSection::ScopedLogSection
                  (&inputAttachmentSection,log,(string *)&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_238);
        uVar8 = local_270;
        lVar4 = *(long *)&pSVar3[uVar9].m_colorAttachments.
                          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                          ._M_impl.super__Vector_impl_data;
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Attachment: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Layout: ");
        ::vk::operator<<((ostream *)poVar12,*(VkImageLayout *)(lVar4 + 4 + uVar8 * 8));
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentSection);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentsSection);
    }
    if (pSVar3[uVar9].m_resolveAttachments.
        super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&pSVar3[uVar9].m_resolveAttachments.
                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                 ._M_impl + 8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"Resolves",(allocator<char> *)&depthStencilAttachmentSection);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Resolves",(allocator<char> *)&local_218);
      tcu::ScopedLogSection::ScopedLogSection
                (&inputAttachmentsSection,log,(string *)&local_1d0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d0);
      for (local_270 = 0;
          local_270 <
          (ulong)((long)*(pointer *)
                         ((long)&pSVar3[uVar9].m_resolveAttachments.
                                 super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                                 ._M_impl + 8) -
                  *(long *)&pSVar3[uVar9].m_resolveAttachments.
                            super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                            ._M_impl.super__Vector_impl_data >> 3); local_270 = local_270 + 1) {
        de::toString<unsigned_long>(&local_238,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,"Resolve",&local_238);
        de::toString<unsigned_long>(&local_218,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depthStencilAttachmentSection,"Resolve ",&local_218);
        tcu::ScopedLogSection::ScopedLogSection
                  (&inputAttachmentSection,log,(string *)&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_238);
        uVar8 = local_270;
        lVar4 = *(long *)&pSVar3[uVar9].m_resolveAttachments.
                          super__Vector_base<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
                          ._M_impl.super__Vector_impl_data;
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Attachment: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        poVar12 = &local_1d0.m_str;
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Layout: ");
        ::vk::operator<<((ostream *)poVar12,*(VkImageLayout *)(lVar4 + 4 + uVar8 * 8));
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
        tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentSection);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentsSection);
    }
    poVar12 = &local_1d0.m_str;
    if (pSVar3[uVar9].m_preserveAttachments.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start !=
        *(pointer *)
         ((long)&pSVar3[uVar9].m_preserveAttachments.
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl + 8)) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"Preserves",(allocator<char> *)&depthStencilAttachmentSection)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_238,"Preserves",(allocator<char> *)&local_218);
      tcu::ScopedLogSection::ScopedLogSection
                (&inputAttachmentsSection,log,(string *)&local_1d0,&local_238);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::string::~string((string *)&local_1d0);
      for (local_270 = 0;
          local_270 <
          (ulong)((long)*(pointer *)
                         ((long)&pSVar3[uVar9].m_preserveAttachments.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl + 8) -
                  *(long *)&pSVar3[uVar9].m_preserveAttachments.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data >> 2); local_270 = local_270 + 1) {
        de::toString<unsigned_long>(&local_238,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_1d0,"Preserve",&local_238);
        de::toString<unsigned_long>(&local_218,&local_270);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &depthStencilAttachmentSection,"Preserve ",&local_218);
        tcu::ScopedLogSection::ScopedLogSection
                  (&inputAttachmentSection,log,(string *)&local_1d0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
        std::__cxx11::string::~string((string *)&local_218);
        std::__cxx11::string::~string((string *)&local_1d0);
        std::__cxx11::string::~string((string *)&local_238);
        local_1d0.m_log = log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
        std::operator<<((ostream *)poVar12,"Attachment: ");
        std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
        tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
        tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentSection);
      }
      tcu::ScopedLogSection::~ScopedLogSection(&inputAttachmentsSection);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&attachmentSection);
    local_258 = local_258 + 1;
  }
  tcu::ScopedLogSection::~ScopedLogSection(&attachmentsSection);
  if ((config->renderPass).m_dependencies.
      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (config->renderPass).m_dependencies.
      super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,"Dependencies",(allocator<char> *)&depthStencilAttachmentSection
              );
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_238,"Dependencies",(allocator<char> *)&local_218);
    tcu::ScopedLogSection::ScopedLogSection(&attachmentsSection,log,(string *)&local_1d0,&local_238)
    ;
    std::__cxx11::string::~string((string *)&local_238);
    std::__cxx11::string::~string((string *)&local_1d0);
    poVar12 = &local_1d0.m_str;
    poVar1 = &local_1d0.m_str;
    local_258 = 0;
    while( true ) {
      if ((ulong)(((long)(config->renderPass).m_dependencies.
                         super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(config->renderPass).m_dependencies.
                        super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x1c) <= local_258) break;
      de::toString<unsigned_long>(&local_238,&local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0
                     ,"Dependency",&local_238);
      de::toString<unsigned_long>(&local_218,&local_258);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &depthStencilAttachmentSection,"Dependency ",&local_218);
      tcu::ScopedLogSection::ScopedLogSection
                (&attachmentSection,log,(string *)&local_1d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &depthStencilAttachmentSection);
      std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
      std::__cxx11::string::~string((string *)&local_218);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_238);
      uVar9 = local_258;
      pSVar5 = (config->renderPass).m_dependencies.
               super__Vector_base<vkt::(anonymous_namespace)::SubpassDependency,_std::allocator<vkt::(anonymous_namespace)::SubpassDependency>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
      std::operator<<((ostream *)poVar12,"Source: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Destination: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
      poVar2 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Source Stage Mask: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      poVar2 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Destination Stage Mask: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      poVar2 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Input Mask: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      poVar2 = &local_1d0.m_str;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar2);
      std::operator<<((ostream *)poVar2,"Output Mask: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
      std::operator<<((ostream *)&local_1d0.m_str,"Dependency Flags: ");
      ::vk::getDependencyFlagsStr((Bitfield<32UL> *)&local_238,pSVar5[uVar9].m_flags);
      this = tcu::MessageBuilder::operator<<(&local_1d0,(Bitfield<32UL> *)&local_238);
      tcu::MessageBuilder::operator<<(this,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
      tcu::ScopedLogSection::~ScopedLogSection(&attachmentSection);
      local_258 = local_258 + 1;
    }
    tcu::ScopedLogSection::~ScopedLogSection(&attachmentsSection);
  }
  tcu::ScopedLogSection::~ScopedLogSection(&section);
  poVar12 = &local_1d0.m_str;
  local_1d0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
  std::operator<<((ostream *)poVar12,"TargetSize: ");
  tcu::operator<<((ostream *)poVar12,&config->targetSize);
  tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
  poVar12 = &local_1d0.m_str;
  local_1d0.m_log = log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
  std::operator<<((ostream *)poVar12,"Render area, Offset: ");
  tcu::operator<<((ostream *)poVar12,&config->renderPos);
  std::operator<<((ostream *)poVar12,", Size: ");
  tcu::operator<<((ostream *)poVar12,&config->renderSize);
  tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
  poVar12 = &local_1d0.m_str;
  poVar1 = &local_1d0.m_str;
  section.m_log = (TestLog *)0x0;
  while( true ) {
    if ((TestLog *)
        ((ulong)(local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p -
        (long)(local_40->super__Bvector_base<std::allocator<bool>_>)._M_impl.
              super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p) * 8) <= section.m_log
       ) break;
    pvVar11 = local_40;
    de::toString<unsigned_long>(&local_238,(unsigned_long *)&section);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "Attachment",&local_238);
    de::toString<unsigned_long>(&local_218,(unsigned_long *)&section);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection,"Attachment ",&local_218);
    tcu::ScopedLogSection::ScopedLogSection
              (&attachmentsSection,log,(string *)&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_238);
    cVar10 = std::vector<bool,_std::allocator<bool>_>::operator[](local_40,(size_type)section.m_log)
    ;
    if (cVar10) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
      std::operator<<((ostream *)poVar12,"Is lazy.");
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
    }
    if ((local_48->
        super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
        )._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_ptr != (VkClearValue *)0x0
       ) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Image is cleared to ");
      pVVar6 = (local_48->
               super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_ptr;
      value._8_8_ = pvVar11;
      value.depthStencil = (&pVVar6->depthStencil)[1];
      vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
                (&local_238,
                 (_anonymous_namespace_ *)
                 (ulong)(config->renderPass).m_attachments.
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_format,
                 (VkFormat)(pVVar6->depthStencil).depth,value);
      std::operator<<((ostream *)poVar1,(string *)&local_238);
      std::operator<<((ostream *)poVar1," before rendering.");
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    if ((*(VkAttachmentLoadOp *)
          ((long)((config->renderPass).m_attachments.
                  super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                  ._M_impl.super__Vector_impl_data._M_start + (long)section.m_log) + 8) ==
         VK_ATTACHMENT_LOAD_OP_CLEAR) &&
       ((local_50->
        super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
        )._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_ptr != (VkClearValue *)0x0
       )) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
      std::operator<<((ostream *)&local_1d0.m_str,"Attachment is cleared to ");
      pVVar6 = (local_50->
               super__Vector_base<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               )._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_ptr;
      value_00._8_8_ = pvVar11;
      value_00.depthStencil = (&pVVar6->depthStencil)[1];
      vkt::(anonymous_namespace)::clearValueToString_abi_cxx11_
                (&local_238,
                 (_anonymous_namespace_ *)
                 (ulong)(config->renderPass).m_attachments.
                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)section.m_log].m_format,
                 (VkFormat)(pVVar6->depthStencil).depth,value_00);
      std::operator<<((ostream *)&local_1d0.m_str,(string *)&local_238);
      std::operator<<((ostream *)&local_1d0.m_str," in the beginning of the render pass.");
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&attachmentsSection);
    section.m_log = (TestLog *)((long)&(section.m_log)->m_log + 1);
  }
  poVar12 = &local_1d0.m_str;
  section.m_log = (TestLog *)0x0;
  pvVar11 = local_40;
  while( true ) {
    if ((TestLog *)
        (((long)(config->renderPass).m_subpasses.
                super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
                ._M_impl.super__Vector_impl_data._M_finish -
         (long)(config->renderPass).m_subpasses.
               super__Vector_base<vkt::(anonymous_namespace)::Subpass,_std::allocator<vkt::(anonymous_namespace)::Subpass>_>
               ._M_impl.super__Vector_impl_data._M_start) / 0x70) <= section.m_log) break;
    de::toString<unsigned_long>(&local_238,(unsigned_long *)&section);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1d0,
                   "Subpass",&local_238);
    de::toString<unsigned_long>(&local_218,(unsigned_long *)&section);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &depthStencilAttachmentSection,"Subpass ",&local_218);
    tcu::ScopedLogSection::ScopedLogSection
              (&attachmentsSection,log,(string *)&local_1d0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&depthStencilAttachmentSection);
    std::__cxx11::string::~string((string *)&local_218);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_238);
    vec_01 = (local_38->
             super__Vector_base<vkt::(anonymous_namespace)::SubpassRenderInfo,_std::allocator<vkt::(anonymous_namespace)::SubpassRenderInfo>_>
             )._M_impl.super__Vector_impl_data._M_start + (long)section.m_log;
    local_1d0.m_log = log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
    poVar1 = &local_1d0.m_str;
    std::operator<<((ostream *)poVar1,"Viewport, offset: ");
    tcu::operator<<((ostream *)poVar1,&vec_01->m_viewportOffset);
    std::operator<<((ostream *)poVar1,", size: ");
    tcu::operator<<((ostream *)poVar1,&vec_01->m_viewportSize);
    tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    if (vec_01->m_isSecondary == true) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
      std::operator<<((ostream *)&local_1d0.m_str,"Subpass uses secondary command buffers");
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    else {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
      std::operator<<((ostream *)&local_1d0.m_str,"Subpass uses inlined commands");
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1d0.m_str);
    uVar13 = 0;
    while( true ) {
      lVar4 = (long)(vec_01->m_colorClears).
                    super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)*(pointer *)
                         ((long)&(vec_01->m_colorClears).
                                 super__Vector_base<vkt::(anonymous_namespace)::ColorClear,_std::allocator<vkt::(anonymous_namespace)::ColorClear>_>
                                 ._M_impl + 8) - lVar4 >> 5) <= (ulong)uVar13) break;
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar12);
      std::operator<<((ostream *)poVar12,"Clearing color attachment ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
      std::operator<<((ostream *)poVar12,". Offset: ");
      lVar15 = (ulong)uVar13 * 0x20;
      vec_00 = (Vector<unsigned_int,_2> *)(lVar4 + lVar15);
      tcu::operator<<((ostream *)poVar12,vec_00);
      std::operator<<((ostream *)poVar12,", Size: ");
      tcu::operator<<((ostream *)poVar12,vec_00 + 1);
      std::operator<<((ostream *)poVar12,", Color: ");
      value_01._8_8_ = pvVar11;
      value_01._0_8_ = *(undefined8 *)vec_00[3].m_data;
      vkt::(anonymous_namespace)::clearColorToString_abi_cxx11_
                (&local_238,
                 (_anonymous_namespace_ *)
                 (ulong)*(uint *)((long)(vec_01->m_colorAttachmentInfo).
                                        super__Vector_base<vkt::(anonymous_namespace)::Attachment,_std::allocator<vkt::(anonymous_namespace)::Attachment>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar15),
                 (VkFormat)*(undefined8 *)vec_00[2].m_data,value_01);
      std::operator<<((ostream *)poVar12,(string *)&local_238);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::string::~string((string *)&local_238);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar12);
      uVar13 = uVar13 + 1;
    }
    vec = (vec_01->m_depthStencilClear).m_ptr;
    poVar1 = &local_1d0.m_str;
    if (vec != (DepthStencilClear *)0x0) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
      std::operator<<((ostream *)poVar1,"Clearing depth stencil attachment");
      std::operator<<((ostream *)poVar1,". Offset: ");
      tcu::operator<<((ostream *)poVar1,&vec->m_offset);
      std::operator<<((ostream *)poVar1,", Size: ");
      tcu::operator<<((ostream *)poVar1,&vec->m_size);
      std::operator<<((ostream *)poVar1,", Depth: ");
      std::ostream::operator<<(poVar1,vec->m_depth);
      std::operator<<((ostream *)poVar1,", Stencil: ");
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    pRVar7 = (vec_01->m_renderQuad).m_ptr;
    if (pRVar7 != (RenderQuad *)0x0) {
      local_1d0.m_log = log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1d0.m_str);
      poVar1 = &local_1d0.m_str;
      std::operator<<((ostream *)poVar1,"Rendering grid quad to ");
      tcu::operator<<((ostream *)poVar1,
                      *(Vector<float,_2> **)
                       &(pRVar7->m_vertices).
                        super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                        ._M_impl);
      std::operator<<((ostream *)poVar1," -> ");
      tcu::operator<<((ostream *)poVar1,
                      (Vector<float,_2> *)
                      (*(long *)&(pRVar7->m_vertices).
                                 super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
                                 ._M_impl + 0x10));
      tcu::MessageBuilder::operator<<(&local_1d0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
    }
    tcu::ScopedLogSection::~ScopedLogSection(&attachmentsSection);
    section.m_log = (TestLog *)((long)&(section.m_log)->m_log + 1);
  }
  return;
}

Assistant:

void logTestCaseInfo (TestLog&								log,
					  const TestConfig&						config,
					  const vector<bool>&					attachmentIsLazy,
					  const vector<Maybe<VkClearValue> >&	imageClearValues,
					  const vector<Maybe<VkClearValue> >&	renderPassClearValues,
					  const vector<SubpassRenderInfo>&		subpassRenderInfo)
{
	const RenderPass&	renderPass	= config.renderPass;

	logRenderPassInfo(log, renderPass);

	DE_ASSERT(attachmentIsLazy.size() == renderPass.getAttachments().size());
	DE_ASSERT(imageClearValues.size() == renderPass.getAttachments().size());
	DE_ASSERT(renderPassClearValues.size() == renderPass.getAttachments().size());

	log << TestLog::Message << "TargetSize: " << config.targetSize << TestLog::EndMessage;
	log << TestLog::Message << "Render area, Offset: " << config.renderPos << ", Size: " << config.renderSize << TestLog::EndMessage;

	for (size_t attachmentNdx = 0; attachmentNdx < attachmentIsLazy.size(); attachmentNdx++)
	{
		const tcu::ScopedLogSection	section	(log, "Attachment" + de::toString(attachmentNdx), "Attachment " + de::toString(attachmentNdx));

		if (attachmentIsLazy[attachmentNdx])
			log << TestLog::Message << "Is lazy." << TestLog::EndMessage;

		if (imageClearValues[attachmentNdx])
			log << TestLog::Message << "Image is cleared to " << clearValueToString(renderPass.getAttachments()[attachmentNdx].getFormat(), *imageClearValues[attachmentNdx]) << " before rendering." << TestLog::EndMessage;

		if (renderPass.getAttachments()[attachmentNdx].getLoadOp() == VK_ATTACHMENT_LOAD_OP_CLEAR && renderPassClearValues[attachmentNdx])
			log << TestLog::Message << "Attachment is cleared to " << clearValueToString(renderPass.getAttachments()[attachmentNdx].getFormat(), *renderPassClearValues[attachmentNdx]) << " in the beginning of the render pass." << TestLog::EndMessage;
	}

	for (size_t subpassNdx = 0; subpassNdx < renderPass.getSubpasses().size(); subpassNdx++)
	{
		const tcu::ScopedLogSection section (log, "Subpass" + de::toString(subpassNdx), "Subpass " + de::toString(subpassNdx));

		logSubpassRenderInfo(log, subpassRenderInfo[subpassNdx]);
	}
}